

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,char *mode)

{
  REF_DBL *pRVar1;
  REF_MPI ref_mpi_00;
  REF_NODE pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_DBL local_170;
  REF_DBL local_168;
  double local_160;
  REF_DBL local_158;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  char normdev_met;
  char long_met;
  char short_met;
  char quality_met;
  char not_ok;
  REF_EDGE pRStack_100;
  char is_ok;
  REF_EDGE ref_edge;
  REF_INT part;
  REF_INT edge;
  REF_DBL delta;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL ratio;
  REF_INT nnode;
  REF_INT node;
  REF_DBL min_normdev;
  REF_DBL normdev;
  REF_DBL min_quality;
  REF_DBL quality;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  char *mode_local;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  pRVar2 = ref_grid->node;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    unique0x00012000 = ref_grid->cell[8];
  }
  else {
    unique0x00012000 = ref_grid->cell[3];
  }
  normdev = 1.0;
  for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max; nodes[0x19] = nodes[0x19] + 1) {
    RVar3 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],(REF_INT *)&quality);
    if (RVar3 == 0) {
      if (ref_grid->twod == 0) {
        if (ref_grid->surf == 0) {
          uVar4 = ref_node_tet_quality(ref_grid->node,(REF_INT *)&quality,&min_quality);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x192,"ref_adapt_tattle",(ulong)uVar4,"qual");
            return uVar4;
          }
        }
        else {
          uVar4 = ref_node_tri_quality(ref_grid->node,(REF_INT *)&quality,&min_quality);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,399,"ref_adapt_tattle",(ulong)uVar4,"qual");
            return uVar4;
          }
        }
      }
      else {
        uVar4 = ref_node_tri_quality(ref_grid->node,(REF_INT *)&quality,&min_quality);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x18c,"ref_adapt_tattle",(ulong)uVar4,"qual");
          return uVar4;
        }
      }
      if (min_quality <= normdev) {
        local_158 = min_quality;
      }
      else {
        local_158 = normdev;
      }
      normdev = local_158;
    }
  }
  min_quality = normdev;
  ref_grid_local._4_4_ = ref_mpi_min(ref_mpi_00,&min_quality,&normdev,3);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&min_quality,1,3);
    if (ref_grid_local._4_4_ == 0) {
      ratio._0_4_ = 0;
      for (ratio._4_4_ = 0; ratio._4_4_ < pRVar2->max; ratio._4_4_ = ratio._4_4_ + 1) {
        if ((((-1 < ratio._4_4_) && (ratio._4_4_ < pRVar2->max)) &&
            (-1 < pRVar2->global[ratio._4_4_])) &&
           (pRVar2->ref_mpi->id == pRVar2->part[ratio._4_4_])) {
          ratio._0_4_ = ratio._0_4_ + 1;
        }
      }
      ref_grid_local._4_4_ = ref_mpi_allsum(ref_mpi_00,&ratio,1,1);
      if (ref_grid_local._4_4_ == 0) {
        _nnode = 2.0;
        if ((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) {
          unique0x00012000 = ref_grid->cell[3];
          for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffc8->max;
              nodes[0x19] = nodes[0x19] + 1) {
            RVar3 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],(REF_INT *)&quality);
            if (RVar3 == 0) {
              uVar4 = ref_geom_tri_norm_deviation(ref_grid,(REF_INT *)&quality,&min_normdev);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x1a7,"ref_adapt_tattle",(ulong)uVar4,"norm dev");
                return uVar4;
              }
              if (min_normdev <= _nnode) {
                local_160 = min_normdev;
              }
              else {
                local_160 = _nnode;
              }
              _nnode = local_160;
            }
          }
        }
        min_normdev = _nnode;
        ref_grid_local._4_4_ = ref_mpi_min(ref_mpi_00,&min_normdev,&nnode,3);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&nnode,1,3);
          if (ref_grid_local._4_4_ == 0) {
            max_ratio = 1e+200;
            delta = -1e+200;
            ref_grid_local._4_4_ = ref_edge_create(&stack0xffffffffffffff00,ref_grid);
            if (ref_grid_local._4_4_ == 0) {
              for (ref_edge._4_4_ = 0; ref_edge._4_4_ < pRStack_100->n;
                  ref_edge._4_4_ = ref_edge._4_4_ + 1) {
                uVar4 = ref_edge_part(pRStack_100,ref_edge._4_4_,(REF_INT *)&ref_edge);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0x1b3,"ref_adapt_tattle",(ulong)uVar4,"edge part");
                  return uVar4;
                }
                if ((int)ref_edge == ref_grid->mpi->id) {
                  uVar4 = ref_node_ratio(ref_grid->node,pRStack_100->e2n[ref_edge._4_4_ << 1],
                                         pRStack_100->e2n[ref_edge._4_4_ * 2 + 1],&min_ratio);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,0x1b8,"ref_adapt_tattle",(ulong)uVar4,"rat");
                    return uVar4;
                  }
                  if (min_ratio <= max_ratio) {
                    local_168 = min_ratio;
                  }
                  else {
                    local_168 = max_ratio;
                  }
                  max_ratio = local_168;
                  if (delta <= min_ratio) {
                    local_170 = min_ratio;
                  }
                  else {
                    local_170 = delta;
                  }
                  delta = local_170;
                }
              }
              ref_grid_local._4_4_ = ref_edge_free(pRStack_100);
              if (ref_grid_local._4_4_ == 0) {
                min_ratio = max_ratio;
                ref_grid_local._4_4_ = ref_mpi_min(ref_mpi_00,&min_ratio,&max_ratio,3);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&max_ratio,1,3);
                  if (ref_grid_local._4_4_ == 0) {
                    min_ratio = delta;
                    ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&min_ratio,&delta,3);
                    if (ref_grid_local._4_4_ == 0) {
                      ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&delta,1,3);
                      if (ref_grid_local._4_4_ == 0) {
                        ref_grid_local._4_4_ = ref_mpi_stopwatch_delta(ref_mpi_00,(REF_DBL *)&part);
                        if (ref_grid_local._4_4_ == 0) {
                          if (ref_grid->mpi->id == 0) {
                            ref_private_macro_code_rss._1_1_ = ' ';
                            ref_private_macro_code_rss._0_1_ = ' ';
                            ref_private_macro_code_rss_1._3_1_ = ' ';
                            ref_private_macro_code_rss_1._2_1_ = ' ';
                            if (normdev < ref_grid->adapt->smooth_min_quality) {
                              ref_private_macro_code_rss._1_1_ = '*';
                            }
                            if (max_ratio < ref_grid->adapt->post_min_ratio) {
                              ref_private_macro_code_rss._0_1_ = '*';
                            }
                            pRVar1 = &ref_grid->adapt->post_max_ratio;
                            if (*pRVar1 <= delta && delta != *pRVar1) {
                              ref_private_macro_code_rss_1._3_1_ = '*';
                            }
                            if (_nnode < ref_grid->adapt->post_min_normdev) {
                              ref_private_macro_code_rss_1._2_1_ = '*';
                            }
                            printf("mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec %5s n %d\n"
                                   ,normdev,max_ratio,delta,_nnode,_part,
                                   (ulong)(uint)(int)ref_private_macro_code_rss._1_1_,
                                   (ulong)(uint)(int)(char)ref_private_macro_code_rss,
                                   (ulong)(uint)(int)ref_private_macro_code_rss_1._3_1_,
                                   (ulong)(uint)(int)ref_private_macro_code_rss_1._2_1_,mode,
                                   ratio._0_4_);
                          }
                          ref_grid_local._4_4_ = 0;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                 ,0x1c5,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"time delta")
                          ;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                               ,0x1c3,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"max");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                             ,0x1c2,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"mpi max");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,0x1c0,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"min");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0x1bf,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"mpi min");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x1bd,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"free edge");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x1b1,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"make edges");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x1ad,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"min");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x1ac,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"mpi max");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x1a0,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"int sum");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x198
             ,"ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"min");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x197,
           "ref_adapt_tattle",(ulong)ref_grid_local._4_4_,"min");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,
                                           const char *mode) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_INT node, nnode;
  REF_DBL ratio, min_ratio, max_ratio, delta;
  REF_INT edge, part;
  REF_EDGE ref_edge;
  char is_ok = ' ';
  char not_ok = '*';
  char quality_met, short_met, long_met, normdev_met;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else if (ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    }
    min_quality = MIN(min_quality, quality);
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  RSS(ref_mpi_stopwatch_delta(ref_mpi, &delta), "time delta");

  if (ref_grid_once(ref_grid)) {
    quality_met = is_ok;
    short_met = is_ok;
    long_met = is_ok;
    normdev_met = is_ok;
    if (min_quality < ref_grid_adapt(ref_grid, smooth_min_quality))
      quality_met = not_ok;
    if (min_ratio < ref_grid_adapt(ref_grid, post_min_ratio))
      short_met = not_ok;
    if (max_ratio > ref_grid_adapt(ref_grid, post_max_ratio)) long_met = not_ok;
    if (min_normdev < ref_grid_adapt(ref_grid, post_min_normdev))
      normdev_met = not_ok;

    printf(
        "mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec "
        "%5s n %d\n",
        quality_met, min_quality, short_met, min_ratio, max_ratio, long_met,
        min_normdev, normdev_met, delta, mode, nnode);
  }

  return REF_SUCCESS;
}